

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O2

void __thiscall
Glucose::SharedCompanion::addLearnt(SharedCompanion *this,ParallelSolver *s,Lit unary)

{
  bool bVar1;
  Lit unary_local;
  
  unary_local = unary;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  bVar1 = lbool::operator==((this->isUnary).data + (unary.x >> 1),(lbool)0x2);
  if (bVar1) {
    vec<Glucose::Lit>::push(&this->unitLit,&unary_local);
    (this->isUnary).data[unary_local.x >> 1].value = (byte)unary_local.x & 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  return;
}

Assistant:

void SharedCompanion::addLearnt(ParallelSolver *s,Lit unary) {
  pthread_mutex_lock(&mutexSharedUnitCompanion);
  if (isUnary[var(unary)]==l_Undef) {
      unitLit.push(unary);
      isUnary[var(unary)] = sign(unary)?l_False:l_True;
  } 
  pthread_mutex_unlock(&mutexSharedUnitCompanion);
}